

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O3

void fdct32_avx2(__m256i *input,__m256i *output,int8_t cos_bit,int instride,int outstride)

{
  __m256i *palVar1;
  undefined4 uVar2;
  __m256i alVar3;
  uint uVar4;
  uint uVar5;
  undefined7 in_register_00000011;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  __m256i alVar42;
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  __m256i alVar46;
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  __m256i alVar54;
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  __m256i alVar60;
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  __m256i alVar63;
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  __m256i alVar69;
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  __m256i alVar74;
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  __m256i alVar80;
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  __m256i alVar86;
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 local_5e8 [32];
  longlong local_5c8;
  longlong lStack_5c0;
  longlong lStack_5b8;
  longlong lStack_5b0;
  undefined1 local_5a8 [32];
  undefined1 local_588 [32];
  undefined1 local_568 [32];
  undefined1 local_548 [32];
  undefined1 local_528 [32];
  undefined1 local_508 [32];
  undefined1 local_4e8 [32];
  undefined1 local_4c8 [32];
  undefined1 local_4a8 [32];
  undefined1 local_488 [32];
  longlong local_468;
  longlong lStack_460;
  longlong lStack_458;
  longlong lStack_450;
  undefined1 local_448 [32];
  undefined1 local_428 [32];
  undefined1 local_3e8 [32];
  undefined1 local_3c8 [32];
  undefined1 local_3a8 [32];
  longlong local_388;
  longlong lStack_380;
  longlong lStack_378;
  longlong lStack_370;
  undefined1 local_368 [32];
  undefined1 local_348 [32];
  undefined1 local_328 [32];
  undefined1 local_308 [32];
  undefined1 local_2c8 [32];
  undefined1 local_2a8 [32];
  undefined1 local_288 [32];
  undefined1 local_258 [32];
  undefined1 local_238 [32];
  undefined1 local_218 [32];
  undefined1 local_1d8 [32];
  longlong local_1b8;
  longlong lStack_1b0;
  longlong lStack_1a8;
  longlong lStack_1a0;
  longlong local_198;
  longlong lStack_190;
  longlong lStack_188;
  longlong lStack_180;
  undefined1 local_178 [32];
  longlong local_158;
  longlong lStack_150;
  longlong lStack_148;
  longlong lStack_140;
  longlong local_138;
  longlong lStack_130;
  longlong lStack_128;
  longlong lStack_120;
  
  auVar87 = vpaddd_avx2((undefined1  [32])input[instride * 0x1b],
                        (undefined1  [32])input[instride * 4]);
  auVar55 = vpsubd_avx2((undefined1  [32])input[instride * 4],
                        (undefined1  [32])input[instride * 0x1b]);
  auVar37 = vpaddd_avx2((undefined1  [32])input[instride * 0x1a],
                        (undefined1  [32])input[instride * 5]);
  auVar23 = vpsubd_avx2((undefined1  [32])input[instride * 5],
                        (undefined1  [32])input[instride * 0x1a]);
  auVar44 = vpaddd_avx2((undefined1  [32])input[instride * 0x19],
                        (undefined1  [32])input[instride * 6]);
  auVar18 = vpsubd_avx2((undefined1  [32])input[instride * 6],
                        (undefined1  [32])input[instride * 0x19]);
  auVar21 = vpaddd_avx2((undefined1  [32])input[instride * 0x18],
                        (undefined1  [32])input[instride * 7]);
  auVar24 = vpsubd_avx2((undefined1  [32])input[instride * 7],
                        (undefined1  [32])input[instride * 0x18]);
  auVar88 = vpaddd_avx2((undefined1  [32])input[instride * 0x17],
                        (undefined1  [32])input[instride * 8]);
  auVar15 = vpsubd_avx2((undefined1  [32])input[instride * 8],
                        (undefined1  [32])input[instride * 0x17]);
  auVar43 = vpaddd_avx2((undefined1  [32])input[instride * 0x16],
                        (undefined1  [32])input[instride * 9]);
  auVar47 = vpsubd_avx2((undefined1  [32])input[instride * 9],
                        (undefined1  [32])input[instride * 0x16]);
  auVar17 = vpaddd_avx2((undefined1  [32])input[instride * 10],
                        (undefined1  [32])input[instride * 0x15]);
  auVar22 = vpsubd_avx2((undefined1  [32])input[instride * 10],
                        (undefined1  [32])input[instride * 0x15]);
  auVar51 = vpaddd_avx2((undefined1  [32])input[instride * 0x14],
                        (undefined1  [32])input[instride * 0xb]);
  auVar14 = vpsubd_avx2((undefined1  [32])input[instride * 0xb],
                        (undefined1  [32])input[instride * 0x14]);
  auVar25 = vpaddd_avx2((undefined1  [32])input[instride * 0x1d],
                        (undefined1  [32])input[instride * 2]);
  auVar16 = vpaddd_avx2((undefined1  [32])input[instride * 0x12],
                        (undefined1  [32])input[instride * 0xd]);
  auVar81 = vpaddd_avx2(auVar16,auVar25);
  auVar28 = vpsubd_avx2(auVar25,auVar16);
  auVar25 = vpaddd_avx2((undefined1  [32])input[instride * 0x1c],
                        (undefined1  [32])input[instride * 3]);
  auVar16 = vpaddd_avx2((undefined1  [32])input[instride * 0x13],
                        (undefined1  [32])input[instride * 0xc]);
  auVar79 = vpaddd_avx2(auVar16,auVar25);
  auVar82 = vpsubd_avx2(auVar25,auVar16);
  auVar25 = vpaddd_avx2(auVar51,auVar87);
  auVar65 = vpsubd_avx2(auVar87,auVar51);
  auVar87 = vpaddd_avx2(auVar17,auVar37);
  auVar75 = vpsubd_avx2(auVar37,auVar17);
  uVar5 = (uint)CONCAT71(in_register_00000011,cos_bit);
  lVar11 = (long)(int)uVar5 * 0x100;
  iVar6 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x1e0);
  iVar9 = -iVar6;
  auVar56._4_4_ = iVar9;
  auVar56._0_4_ = iVar9;
  auVar56._8_4_ = iVar9;
  auVar56._12_4_ = iVar9;
  auVar56._16_4_ = iVar9;
  auVar56._20_4_ = iVar9;
  auVar56._24_4_ = iVar9;
  auVar56._28_4_ = iVar9;
  auVar50._4_4_ = iVar6;
  auVar50._0_4_ = iVar6;
  auVar50._8_4_ = iVar6;
  auVar50._12_4_ = iVar6;
  auVar50._16_4_ = iVar6;
  auVar50._20_4_ = iVar6;
  auVar50._24_4_ = iVar6;
  auVar50._28_4_ = iVar6;
  auVar37 = vpmulld_avx2(auVar56,auVar14);
  auVar17 = vpmulld_avx2(auVar50,auVar55);
  auVar37 = vpaddd_avx2(auVar37,auVar17);
  uVar4 = -uVar5;
  auVar14 = vpmulld_avx2(auVar50,auVar14);
  auVar52 = vpmulld_avx2(auVar56,auVar55);
  auVar66 = vpmulld_avx2(auVar56,auVar22);
  auVar22 = vpmulld_avx2(auVar50,auVar22);
  auVar19 = vpmulld_avx2(auVar50,auVar23);
  auVar70 = vpmulld_avx2(auVar56,auVar23);
  auVar20 = vpmulld_avx2(auVar56,auVar47);
  auVar47 = vpmulld_avx2(auVar50,auVar47);
  auVar48 = vpmulld_avx2(auVar50,auVar18);
  auVar26 = vpmulld_avx2(auVar56,auVar18);
  auVar64 = vpmulld_avx2(auVar56,auVar15);
  auVar62 = vpmulld_avx2(auVar50,auVar15);
  auVar27 = vpmulld_avx2(auVar50,auVar24);
  auVar78 = vpmulld_avx2(auVar56,auVar24);
  auVar17 = vpaddd_avx2((undefined1  [32])*input,(undefined1  [32])input[instride * 0x1f]);
  auVar51 = vpaddd_avx2((undefined1  [32])input[instride * 0x1e],(undefined1  [32])input[instride]);
  auVar16 = vpaddd_avx2((undefined1  [32])input[instride * 0x11],
                        (undefined1  [32])input[instride * 0xe]);
  auVar55 = vpaddd_avx2((undefined1  [32])input[instride * 0x10],
                        (undefined1  [32])input[instride * 0xf]);
  auVar23 = vpaddd_avx2(auVar17,auVar55);
  auVar18 = vpaddd_avx2(auVar16,auVar51);
  auVar24 = vpaddd_avx2(auVar43,auVar44);
  auVar15 = vpaddd_avx2(auVar88,auVar21);
  auVar12 = ZEXT416(uVar5);
  if (cos_bit < '\x01') {
    if (cos_bit == '\0') {
      local_218 = vpsubd_avx2(auVar14,auVar52);
      local_238 = vpaddd_avx2(auVar19,auVar66);
      local_2a8 = vpsubd_avx2(auVar22,auVar70);
      local_348 = vpaddd_avx2(auVar20,auVar48);
      local_3e8 = vpsubd_avx2(auVar47,auVar26);
      local_3a8 = vpaddd_avx2(auVar64,auVar27);
      local_508 = vpsubd_avx2(auVar62,auVar78);
    }
    else {
      auVar37 = vpslld_avx2(auVar37,ZEXT416(uVar4));
      auVar14 = vpsubd_avx2(auVar14,auVar52);
      local_218 = vpslld_avx2(auVar14,ZEXT416(uVar4));
      auVar14 = vpaddd_avx2(auVar19,auVar66);
      auVar13 = ZEXT416(uVar4);
      local_238 = vpslld_avx2(auVar14,auVar13);
      auVar14 = vpsubd_avx2(auVar22,auVar70);
      local_2a8 = vpslld_avx2(auVar14,auVar13);
      auVar14 = vpaddd_avx2(auVar20,auVar48);
      local_348 = vpslld_avx2(auVar14,auVar13);
      auVar14 = vpsubd_avx2(auVar47,auVar26);
      local_3e8 = vpslld_avx2(auVar14,auVar13);
      auVar14 = vpaddd_avx2(auVar64,auVar27);
      local_3a8 = vpslld_avx2(auVar14,ZEXT416(uVar4));
      auVar14 = vpsubd_avx2(auVar62,auVar78);
      local_508 = vpslld_avx2(auVar14,ZEXT416(uVar4));
    }
  }
  else {
    auVar29 = vpsubd_avx2(auVar14,auVar52);
    iVar6 = 1 << (cos_bit - 1U & 0x1f);
    auVar14 = vpaddd_avx2(auVar19,auVar66);
    auVar19 = vpsubd_avx2(auVar22,auVar70);
    auVar61._4_4_ = iVar6;
    auVar61._0_4_ = iVar6;
    auVar61._8_4_ = iVar6;
    auVar61._12_4_ = iVar6;
    auVar61._16_4_ = iVar6;
    auVar61._20_4_ = iVar6;
    auVar61._24_4_ = iVar6;
    auVar61._28_4_ = iVar6;
    auVar52 = vpaddd_avx2(auVar48,auVar61);
    auVar52 = vpaddd_avx2(auVar52,auVar20);
    auVar70 = vpsubd_avx2(auVar47,auVar26);
    auVar66 = vpaddd_avx2(auVar27,auVar61);
    auVar66 = vpaddd_avx2(auVar66,auVar64);
    auVar20 = vpsubd_avx2(auVar62,auVar78);
    auVar37 = vpaddd_avx2(auVar61,auVar37);
    auVar22 = vpaddd_avx2(auVar29,auVar61);
    auVar14 = vpaddd_avx2(auVar14,auVar61);
    auVar19 = vpaddd_avx2(auVar19,auVar61);
    auVar70 = vpaddd_avx2(auVar70,auVar61);
    auVar20 = vpaddd_avx2(auVar20,auVar61);
    auVar37 = vpsrad_avx2(auVar37,auVar12);
    auVar13 = ZEXT416(uVar5);
    local_218 = vpsrad_avx2(auVar22,auVar13);
    local_238 = vpsrad_avx2(auVar14,auVar13);
    local_2a8 = vpsrad_avx2(auVar19,auVar13);
    local_348 = vpsrad_avx2(auVar52,auVar13);
    auVar13 = ZEXT416(uVar5);
    local_3e8 = vpsrad_avx2(auVar70,auVar13);
    local_3a8 = vpsrad_avx2(auVar66,auVar13);
    local_508 = vpsrad_avx2(auVar20,auVar13);
  }
  auVar47 = vpsubd_avx2((undefined1  [32])input[instride * 2],
                        (undefined1  [32])input[instride * 0x1d]);
  auVar48 = vpsubd_avx2((undefined1  [32])input[instride * 3],
                        (undefined1  [32])input[instride * 0x1c]);
  auVar26 = vpsubd_avx2((undefined1  [32])input[instride * 0xc],
                        (undefined1  [32])input[instride * 0x13]);
  auVar64 = vpsubd_avx2((undefined1  [32])input[instride * 0xd],
                        (undefined1  [32])input[instride * 0x12]);
  auVar14 = vpaddd_avx2(auVar15,auVar23);
  auVar52 = vpaddd_avx2(auVar24,auVar18);
  auVar62 = vpsubd_avx2(auVar18,auVar24);
  auVar18 = vpaddd_avx2(auVar81,auVar87);
  auVar27 = vpsubd_avx2(auVar81,auVar87);
  auVar87 = vpmulld_avx2(auVar56,auVar75);
  auVar81 = vpmulld_avx2(auVar50,auVar28);
  auVar87 = vpaddd_avx2(auVar87,auVar81);
  auVar24 = vpmulld_avx2(auVar50,auVar75);
  auVar66 = vpmulld_avx2(auVar56,auVar28);
  auVar22 = vpmulld_avx2(auVar56,auVar65);
  auVar19 = vpmulld_avx2(auVar50,auVar82);
  auVar70 = vpmulld_avx2(auVar50,auVar65);
  auVar20 = vpmulld_avx2(auVar56,auVar82);
  auVar81 = vpaddd_avx2(auVar25,auVar79);
  if (cos_bit < '\x01') {
    if (cos_bit == '\0') {
      local_4c8 = vpsubd_avx2(auVar24,auVar66);
      local_448 = vpaddd_avx2(auVar22,auVar19);
      auVar24 = vpsubd_avx2(auVar70,auVar20);
    }
    else {
      auVar87 = vpslld_avx2(auVar87,ZEXT416(uVar4));
      auVar24 = vpsubd_avx2(auVar24,auVar66);
      local_4c8 = vpslld_avx2(auVar24,ZEXT416(uVar4));
      auVar24 = vpaddd_avx2(auVar22,auVar19);
      local_448 = vpslld_avx2(auVar24,ZEXT416(uVar4));
      auVar24 = vpsubd_avx2(auVar70,auVar20);
      auVar24 = vpslld_avx2(auVar24,ZEXT416(uVar4));
    }
  }
  else {
    iVar6 = 1 << (cos_bit - 1U & 0x1f);
    auVar78._4_4_ = iVar6;
    auVar78._0_4_ = iVar6;
    auVar78._8_4_ = iVar6;
    auVar78._12_4_ = iVar6;
    auVar78._16_4_ = iVar6;
    auVar78._20_4_ = iVar6;
    auVar78._24_4_ = iVar6;
    auVar78._28_4_ = iVar6;
    auVar87 = vpaddd_avx2(auVar87,auVar78);
    auVar87 = vpsrad_avx2(auVar87,auVar12);
    auVar24 = vpsubd_avx2(auVar24,auVar66);
    auVar24 = vpaddd_avx2(auVar78,auVar24);
    local_4c8 = vpsrad_avx2(auVar24,auVar12);
    auVar24 = vpaddd_avx2(auVar22,auVar78);
    auVar24 = vpaddd_avx2(auVar24,auVar19);
    local_448 = vpsrad_avx2(auVar24,auVar12);
    auVar24 = vpsubd_avx2(auVar70,auVar20);
    auVar24 = vpaddd_avx2(auVar78,auVar24);
    auVar24 = vpsrad_avx2(auVar24,auVar12);
  }
  auVar66 = vpsubd_avx2(auVar51,auVar16);
  auVar22 = vpsubd_avx2(auVar44,auVar43);
  auVar44 = vpaddd_avx2(local_238,auVar64);
  auVar19 = vpsubd_avx2(auVar64,local_238);
  auVar43 = vpaddd_avx2(auVar37,auVar26);
  auVar70 = vpsubd_avx2(auVar26,auVar37);
  auVar20 = vpsubd_avx2(auVar47,local_2a8);
  auVar37 = vpaddd_avx2(local_2a8,auVar47);
  auVar47 = vpsubd_avx2(auVar48,local_218);
  auVar51 = vpaddd_avx2(local_218,auVar48);
  auVar16 = vpaddd_avx2(auVar81,auVar14);
  auVar48 = vpsubd_avx2(auVar14,auVar81);
  auVar81 = vpaddd_avx2(auVar52,auVar18);
  auVar52 = vpsubd_avx2(auVar52,auVar18);
  auVar18 = vpmulld_avx2(auVar56,auVar27);
  auVar14 = vpmulld_avx2(auVar50,auVar62);
  local_4e8 = vpaddd_avx2(auVar14,auVar18);
  auVar18 = vpmulld_avx2(auVar56,auVar62);
  auVar14 = vpmulld_avx2(auVar50,auVar27);
  if (cos_bit < '\x01') {
    if (cos_bit == '\0') {
      auVar18 = vpsubd_avx2(auVar14,auVar18);
    }
    else {
      local_4e8 = vpslld_avx2(local_4e8,ZEXT416(uVar4));
      auVar18 = vpsubd_avx2(auVar14,auVar18);
      auVar18 = vpslld_avx2(auVar18,ZEXT416(uVar4));
    }
  }
  else {
    iVar6 = 1 << (cos_bit - 1U & 0x1f);
    auVar64._4_4_ = iVar6;
    auVar64._0_4_ = iVar6;
    auVar64._8_4_ = iVar6;
    auVar64._12_4_ = iVar6;
    auVar64._16_4_ = iVar6;
    auVar64._20_4_ = iVar6;
    auVar64._24_4_ = iVar6;
    auVar64._28_4_ = iVar6;
    auVar26 = vpaddd_avx2(auVar64,local_4e8);
    local_4e8 = vpsrad_avx2(auVar26,auVar12);
    auVar18 = vpsubd_avx2(auVar14,auVar18);
    auVar18 = vpaddd_avx2(auVar64,auVar18);
    auVar18 = vpsrad_avx2(auVar18,auVar12);
  }
  auVar82 = local_4e8;
  auVar62 = vpsubd_avx2(auVar23,auVar15);
  auVar27 = vpsubd_avx2(auVar79,auVar25);
  iVar6 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x1a0);
  iVar9 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x220);
  iVar7 = -iVar6;
  auVar25 = vpaddd_avx2(auVar87,auVar22);
  auVar78 = vpsubd_avx2(auVar22,auVar87);
  auVar28 = vpsubd_avx2(auVar66,local_4c8);
  auVar87 = vpaddd_avx2(auVar66,local_4c8);
  auVar75._4_4_ = iVar7;
  auVar75._0_4_ = iVar7;
  auVar75._8_4_ = iVar7;
  auVar75._12_4_ = iVar7;
  auVar75._16_4_ = iVar7;
  auVar75._20_4_ = iVar7;
  auVar75._24_4_ = iVar7;
  auVar75._28_4_ = iVar7;
  auVar65._4_4_ = iVar9;
  auVar65._0_4_ = iVar9;
  auVar65._8_4_ = iVar9;
  auVar65._12_4_ = iVar9;
  auVar65._16_4_ = iVar9;
  auVar65._20_4_ = iVar9;
  auVar65._24_4_ = iVar9;
  auVar65._28_4_ = iVar9;
  auVar79 = vpmulld_avx2(auVar75,auVar44);
  auVar23 = vpmulld_avx2(auVar65,auVar37);
  local_5a8 = vpaddd_avx2(auVar23,auVar79);
  auVar44 = vpmulld_avx2(auVar65,auVar44);
  auVar37 = vpmulld_avx2(auVar75,auVar37);
  auVar16 = vpmulld_avx2(auVar50,auVar16);
  auVar81 = vpmulld_avx2(auVar50,auVar81);
  auVar79 = vpmulld_avx2(auVar75,auVar43);
  auVar43 = vpmulld_avx2(auVar65,auVar43);
  auVar23 = vpmulld_avx2(auVar65,auVar51);
  auVar51 = vpmulld_avx2(auVar75,auVar51);
  auVar15 = vpmulld_avx2(auVar75,auVar47);
  auVar14 = vpmulld_avx2(auVar75,auVar70);
  auVar66 = vpmulld_avx2(auVar75,auVar20);
  auVar22 = vpmulld_avx2(auVar75,auVar19);
  auVar26 = vpmulld_avx2(auVar65,auVar52);
  auVar64 = vpmulld_avx2(auVar65,auVar48);
  if (cos_bit < '\x01') {
    if (cos_bit == '\0') {
      local_1d8 = vpsubd_avx2(auVar44,auVar37);
      local_488 = vpaddd_avx2(auVar23,auVar79);
      local_4a8 = vpsubd_avx2(auVar43,auVar51);
    }
    else {
      local_5a8 = vpslld_avx2(local_5a8,ZEXT416(uVar4));
      auVar37 = vpsubd_avx2(auVar44,auVar37);
      local_1d8 = vpslld_avx2(auVar37,ZEXT416(uVar4));
      auVar37 = vpaddd_avx2(auVar23,auVar79);
      local_488 = vpslld_avx2(auVar37,ZEXT416(uVar4));
      auVar37 = vpsubd_avx2(auVar43,auVar51);
      local_4a8 = vpslld_avx2(auVar37,ZEXT416(uVar4));
    }
    iVar9 = -iVar9;
    auVar51._4_4_ = iVar9;
    auVar51._0_4_ = iVar9;
    auVar51._8_4_ = iVar9;
    auVar51._12_4_ = iVar9;
    auVar51._16_4_ = iVar9;
    auVar51._20_4_ = iVar9;
    auVar51._24_4_ = iVar9;
    auVar51._28_4_ = iVar9;
    auVar37 = vpmulld_avx2(auVar51,auVar70);
    local_548 = vpaddd_avx2(auVar37,auVar15);
    auVar37 = vpmulld_avx2(auVar51,auVar47);
    auVar44 = vpmulld_avx2(auVar51,auVar19);
    auVar43 = vpmulld_avx2(auVar51,auVar20);
    if (cos_bit == '\0') {
      local_368 = vpsubd_avx2(auVar14,auVar37);
      local_5e8 = vpaddd_avx2(auVar44,auVar66);
      local_528 = vpsubd_avx2(auVar22,auVar43);
      local_328 = vpaddd_avx2(auVar16,auVar81);
      local_4c8 = vpsubd_avx2(auVar16,auVar81);
      auVar44._4_4_ = iVar6;
      auVar44._0_4_ = iVar6;
      auVar44._8_4_ = iVar6;
      auVar44._12_4_ = iVar6;
      auVar44._16_4_ = iVar6;
      auVar44._20_4_ = iVar6;
      auVar44._24_4_ = iVar6;
      auVar44._28_4_ = iVar6;
      auVar37 = vpmulld_avx2(auVar44,auVar48);
      local_3c8 = vpaddd_avx2(auVar37,auVar26);
      auVar37 = vpmulld_avx2(auVar44,auVar52);
      local_308 = vpsubd_avx2(auVar64,auVar37);
    }
    else {
      local_548 = vpslld_avx2(local_548,ZEXT416(uVar4));
      auVar37 = vpsubd_avx2(auVar14,auVar37);
      local_368 = vpslld_avx2(auVar37,ZEXT416(uVar4));
      auVar37 = vpaddd_avx2(auVar44,auVar66);
      auVar13 = ZEXT416(uVar4);
      local_5e8 = vpslld_avx2(auVar37,auVar13);
      auVar37 = vpsubd_avx2(auVar22,auVar43);
      local_528 = vpslld_avx2(auVar37,auVar13);
      auVar37 = vpaddd_avx2(auVar16,auVar81);
      local_328 = vpslld_avx2(auVar37,auVar13);
      auVar37 = vpsubd_avx2(auVar16,auVar81);
      local_4c8 = vpslld_avx2(auVar37,auVar13);
      auVar43._4_4_ = iVar6;
      auVar43._0_4_ = iVar6;
      auVar43._8_4_ = iVar6;
      auVar43._12_4_ = iVar6;
      auVar43._16_4_ = iVar6;
      auVar43._20_4_ = iVar6;
      auVar43._24_4_ = iVar6;
      auVar43._28_4_ = iVar6;
      auVar37 = vpmulld_avx2(auVar43,auVar48);
      auVar37 = vpaddd_avx2(auVar37,auVar26);
      local_3c8 = vpslld_avx2(auVar37,ZEXT416(uVar4));
      auVar37 = vpmulld_avx2(auVar43,auVar52);
      auVar37 = vpsubd_avx2(auVar64,auVar37);
      local_308 = vpslld_avx2(auVar37,ZEXT416(uVar4));
    }
  }
  else {
    auVar50 = vpsubd_avx2(auVar44,auVar37);
    auVar37 = vpaddd_avx2(auVar23,auVar79);
    auVar56 = vpsubd_avx2(auVar43,auVar51);
    iVar9 = -iVar9;
    auVar51._4_4_ = iVar9;
    auVar51._0_4_ = iVar9;
    auVar51._8_4_ = iVar9;
    auVar51._12_4_ = iVar9;
    auVar51._16_4_ = iVar9;
    auVar51._20_4_ = iVar9;
    auVar51._24_4_ = iVar9;
    auVar51._28_4_ = iVar9;
    auVar44 = vpmulld_avx2(auVar51,auVar70);
    auVar44 = vpaddd_avx2(auVar44,auVar15);
    auVar43 = vpmulld_avx2(auVar51,auVar47);
    auVar14 = vpsubd_avx2(auVar14,auVar43);
    auVar43 = vpmulld_avx2(auVar51,auVar19);
    auVar43 = vpaddd_avx2(auVar43,auVar66);
    auVar79 = vpmulld_avx2(auVar51,auVar20);
    auVar66 = vpsubd_avx2(auVar22,auVar79);
    iVar9 = 1 << (cos_bit - 1U & 0x1f);
    auVar70._4_4_ = iVar9;
    auVar70._0_4_ = iVar9;
    auVar70._8_4_ = iVar9;
    auVar70._12_4_ = iVar9;
    auVar70._16_4_ = iVar9;
    auVar70._20_4_ = iVar9;
    auVar70._24_4_ = iVar9;
    auVar70._28_4_ = iVar9;
    auVar79 = vpaddd_avx2(auVar70,auVar16);
    auVar79 = vpaddd_avx2(auVar79,auVar81);
    auVar22 = vpsubd_avx2(auVar16,auVar81);
    auVar81._4_4_ = iVar6;
    auVar81._0_4_ = iVar6;
    auVar81._8_4_ = iVar6;
    auVar81._12_4_ = iVar6;
    auVar81._16_4_ = iVar6;
    auVar81._20_4_ = iVar6;
    auVar81._24_4_ = iVar6;
    auVar81._28_4_ = iVar6;
    auVar16 = vpmulld_avx2(auVar81,auVar48);
    auVar16 = vpaddd_avx2(auVar16,auVar70);
    auVar16 = vpaddd_avx2(auVar16,auVar26);
    auVar81 = vpmulld_avx2(auVar81,auVar52);
    auVar19 = vpsubd_avx2(auVar64,auVar81);
    auVar81 = vpaddd_avx2(auVar70,local_5a8);
    auVar23 = vpaddd_avx2(auVar70,auVar50);
    auVar37 = vpaddd_avx2(auVar70,auVar37);
    auVar15 = vpaddd_avx2(auVar70,auVar56);
    auVar44 = vpaddd_avx2(auVar70,auVar44);
    auVar14 = vpaddd_avx2(auVar70,auVar14);
    auVar43 = vpaddd_avx2(auVar70,auVar43);
    auVar52 = vpaddd_avx2(auVar70,auVar66);
    auVar66 = vpaddd_avx2(auVar70,auVar22);
    auVar22 = vpaddd_avx2(auVar19,auVar70);
    local_5a8 = vpsrad_avx2(auVar81,auVar12);
    local_1d8 = vpsrad_avx2(auVar23,auVar12);
    local_488 = vpsrad_avx2(auVar37,auVar12);
    local_4a8 = vpsrad_avx2(auVar15,auVar12);
    local_548 = vpsrad_avx2(auVar44,auVar12);
    local_368 = vpsrad_avx2(auVar14,auVar12);
    local_5e8 = vpsrad_avx2(auVar43,auVar12);
    local_528 = vpsrad_avx2(auVar52,auVar12);
    local_328 = vpsrad_avx2(auVar79,auVar12);
    local_4c8 = vpsrad_avx2(auVar66,auVar12);
    local_3c8 = vpsrad_avx2(auVar16,auVar12);
    local_308 = vpsrad_avx2(auVar22,auVar12);
  }
  auVar79 = vpsubd_avx2((undefined1  [32])input[instride],(undefined1  [32])input[instride * 0x1e]);
  auVar23 = vpsubd_avx2((undefined1  [32])input[instride * 0xe],
                        (undefined1  [32])input[instride * 0x11]);
  auVar37 = vpmulld_avx2(auVar75,auVar25);
  auVar44 = vpmulld_avx2(auVar65,auVar87);
  local_258 = vpaddd_avx2(auVar44,auVar37);
  auVar37 = vpaddd_avx2(local_4e8,auVar27);
  auVar44 = vpmulld_avx2(auVar65,auVar25);
  auVar43 = vpmulld_avx2(auVar75,auVar87);
  auVar25 = vpmulld_avx2(auVar51,auVar78);
  auVar16 = vpmulld_avx2(auVar75,auVar78);
  auVar81 = vpmulld_avx2(auVar75,auVar28);
  auVar51 = vpmulld_avx2(auVar51,auVar28);
  auVar87 = vpaddd_avx2(auVar18,auVar62);
  if (cos_bit < '\x01') {
    if (cos_bit == '\0') {
      local_4e8 = vpsubd_avx2(auVar44,auVar43);
      local_568 = vpaddd_avx2(auVar25,auVar81);
      auVar44 = vpsubd_avx2(auVar16,auVar51);
    }
    else {
      local_258 = vpslld_avx2(local_258,ZEXT416(uVar4));
      auVar44 = vpsubd_avx2(auVar44,auVar43);
      local_4e8 = vpslld_avx2(auVar44,ZEXT416(uVar4));
      auVar44 = vpaddd_avx2(auVar25,auVar81);
      local_568 = vpslld_avx2(auVar44,ZEXT416(uVar4));
      auVar44 = vpsubd_avx2(auVar16,auVar51);
      auVar44 = vpslld_avx2(auVar44,ZEXT416(uVar4));
    }
  }
  else {
    iVar6 = 1 << (cos_bit - 1U & 0x1f);
    auVar14._4_4_ = iVar6;
    auVar14._0_4_ = iVar6;
    auVar14._8_4_ = iVar6;
    auVar14._12_4_ = iVar6;
    auVar14._16_4_ = iVar6;
    auVar14._20_4_ = iVar6;
    auVar14._24_4_ = iVar6;
    auVar14._28_4_ = iVar6;
    auVar15 = vpaddd_avx2(local_258,auVar14);
    local_258 = vpsrad_avx2(auVar15,auVar12);
    auVar44 = vpsubd_avx2(auVar44,auVar43);
    auVar44 = vpaddd_avx2(auVar44,auVar14);
    local_4e8 = vpsrad_avx2(auVar44,auVar12);
    auVar44 = vpaddd_avx2(auVar25,auVar81);
    auVar44 = vpaddd_avx2(auVar44,auVar14);
    local_568 = vpsrad_avx2(auVar44,auVar12);
    auVar44 = vpsubd_avx2(auVar16,auVar51);
    auVar44 = vpaddd_avx2(auVar44,auVar14);
    auVar44 = vpsrad_avx2(auVar44,auVar12);
  }
  auVar43 = vpaddd_avx2(local_348,auVar23);
  auVar81 = vpsubd_avx2(auVar23,local_348);
  auVar23 = vpsubd_avx2(auVar79,local_3e8);
  auVar51 = vpaddd_avx2(local_3e8,auVar79);
  auVar79 = vpsubd_avx2(auVar27,auVar82);
  auVar18 = vpsubd_avx2(auVar62,auVar18);
  iVar6 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x180);
  iVar9 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x240);
  auVar15._4_4_ = iVar6;
  auVar15._0_4_ = iVar6;
  auVar15._8_4_ = iVar6;
  auVar15._12_4_ = iVar6;
  auVar15._16_4_ = iVar6;
  auVar15._20_4_ = iVar6;
  auVar15._24_4_ = iVar6;
  auVar15._28_4_ = iVar6;
  auVar52._4_4_ = iVar9;
  auVar52._0_4_ = iVar9;
  auVar52._8_4_ = iVar9;
  auVar52._12_4_ = iVar9;
  auVar52._16_4_ = iVar9;
  auVar52._20_4_ = iVar9;
  auVar52._24_4_ = iVar9;
  auVar52._28_4_ = iVar9;
  auVar25 = vpmulld_avx2(auVar15,auVar87);
  auVar16 = vpmulld_avx2(auVar52,auVar37);
  local_178 = vpaddd_avx2(auVar16,auVar25);
  auVar87 = vpmulld_avx2(auVar52,auVar87);
  auVar37 = vpmulld_avx2(auVar15,auVar37);
  if (cos_bit < '\x01') {
    if (cos_bit == '\0') {
      auVar87 = vpsubd_avx2(auVar87,auVar37);
    }
    else {
      local_178 = vpslld_avx2(local_178,ZEXT416(uVar4));
      auVar87 = vpsubd_avx2(auVar87,auVar37);
      auVar87 = vpslld_avx2(auVar87,ZEXT416(uVar4));
    }
  }
  else {
    iVar7 = 1 << (cos_bit - 1U & 0x1f);
    auVar16._4_4_ = iVar7;
    auVar16._0_4_ = iVar7;
    auVar16._8_4_ = iVar7;
    auVar16._12_4_ = iVar7;
    auVar16._16_4_ = iVar7;
    auVar16._20_4_ = iVar7;
    auVar16._24_4_ = iVar7;
    auVar16._28_4_ = iVar7;
    auVar25 = vpaddd_avx2(local_178,auVar16);
    local_178 = vpsrad_avx2(auVar25,auVar12);
    auVar87 = vpsubd_avx2(auVar87,auVar37);
    auVar87 = vpaddd_avx2(auVar87,auVar16);
    auVar87 = vpsrad_avx2(auVar87,auVar12);
  }
  auVar25 = vpsubd_avx2(auVar17,auVar55);
  auVar16 = vpsubd_avx2(auVar21,auVar88);
  auVar37 = vpaddd_avx2(auVar43,local_5a8);
  auVar55 = vpsubd_avx2(auVar43,local_5a8);
  auVar15 = vpsubd_avx2(auVar51,local_1d8);
  auVar21 = vpaddd_avx2(local_1d8,auVar51);
  iVar7 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x1c0);
  iVar10 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x200);
  auVar17._4_4_ = iVar10;
  auVar17._0_4_ = iVar10;
  auVar17._8_4_ = iVar10;
  auVar17._12_4_ = iVar10;
  auVar17._16_4_ = iVar10;
  auVar17._20_4_ = iVar10;
  auVar17._24_4_ = iVar10;
  auVar17._28_4_ = iVar10;
  auVar66._4_4_ = iVar7;
  auVar66._0_4_ = iVar7;
  auVar66._8_4_ = iVar7;
  auVar66._12_4_ = iVar7;
  auVar66._16_4_ = iVar7;
  auVar66._20_4_ = iVar7;
  auVar66._24_4_ = iVar7;
  auVar66._28_4_ = iVar7;
  auVar88 = vpmulld_avx2(auVar17,auVar18);
  auVar43 = vpmulld_avx2(auVar66,auVar79);
  auVar88 = vpaddd_avx2(auVar43,auVar88);
  auVar51 = vpsubd_avx2(auVar81,local_5e8);
  auVar43 = vpmulld_avx2(auVar17,auVar79);
  auVar79 = vpsubd_avx2(auVar23,local_528);
  auVar17 = vpmulld_avx2(auVar66,auVar18);
  if (cos_bit < '\x01') {
    if (cos_bit == '\0') {
      auVar43 = vpsubd_avx2(auVar17,auVar43);
    }
    else {
      auVar88 = vpslld_avx2(auVar88,ZEXT416(uVar4));
      auVar43 = vpsubd_avx2(auVar17,auVar43);
      auVar43 = vpslld_avx2(auVar43,ZEXT416(uVar4));
    }
  }
  else {
    iVar8 = 1 << (cos_bit - 1U & 0x1f);
    auVar18._4_4_ = iVar8;
    auVar18._0_4_ = iVar8;
    auVar18._8_4_ = iVar8;
    auVar18._12_4_ = iVar8;
    auVar18._16_4_ = iVar8;
    auVar18._20_4_ = iVar8;
    auVar18._24_4_ = iVar8;
    auVar18._28_4_ = iVar8;
    auVar88 = vpaddd_avx2(auVar88,auVar18);
    auVar88 = vpsrad_avx2(auVar88,auVar12);
    auVar43 = vpsubd_avx2(auVar17,auVar43);
    auVar43 = vpaddd_avx2(auVar43,auVar18);
    auVar43 = vpsrad_avx2(auVar43,auVar12);
  }
  auVar17 = vpaddd_avx2(auVar16,local_448);
  auVar18 = vpaddd_avx2(auVar25,auVar24);
  auVar81 = vpaddd_avx2(auVar81,local_5e8);
  auVar23 = vpaddd_avx2(auVar23,local_528);
  iVar6 = -iVar6;
  auVar19._4_4_ = iVar6;
  auVar19._0_4_ = iVar6;
  auVar19._8_4_ = iVar6;
  auVar19._12_4_ = iVar6;
  auVar19._16_4_ = iVar6;
  auVar19._20_4_ = iVar6;
  auVar19._24_4_ = iVar6;
  auVar19._28_4_ = iVar6;
  auVar14 = vpmulld_avx2(auVar19,auVar37);
  auVar22 = vpmulld_avx2(auVar52,auVar21);
  local_5e8 = vpaddd_avx2(auVar22,auVar14);
  auVar37 = vpmulld_avx2(auVar52,auVar37);
  auVar21 = vpmulld_avx2(auVar19,auVar21);
  auVar14 = vpmulld_avx2(auVar19,auVar15);
  auVar52 = vpmulld_avx2(auVar19,auVar55);
  auVar22 = vpmulld_avx2(auVar66,auVar79);
  auVar66 = vpmulld_avx2(auVar66,auVar51);
  if (cos_bit < '\x01') {
    if (cos_bit == '\0') {
      local_3e8 = vpsubd_avx2(auVar37,auVar21);
    }
    else {
      local_5e8 = vpslld_avx2(local_5e8,ZEXT416(uVar4));
      auVar37 = vpsubd_avx2(auVar37,auVar21);
      local_3e8 = vpslld_avx2(auVar37,ZEXT416(uVar4));
    }
    iVar9 = -iVar9;
    auVar21._4_4_ = iVar9;
    auVar21._0_4_ = iVar9;
    auVar21._8_4_ = iVar9;
    auVar21._12_4_ = iVar9;
    auVar21._16_4_ = iVar9;
    auVar21._20_4_ = iVar9;
    auVar21._24_4_ = iVar9;
    auVar21._28_4_ = iVar9;
    auVar37 = vpmulld_avx2(auVar21,auVar55);
    local_588 = vpaddd_avx2(auVar14,auVar37);
    auVar37 = vpmulld_avx2(auVar21,auVar15);
    if (cos_bit == '\0') {
      auVar37 = vpsubd_avx2(auVar52,auVar37);
    }
    else {
      local_588 = vpslld_avx2(local_588,ZEXT416(uVar4));
      auVar37 = vpsubd_avx2(auVar52,auVar37);
      auVar37 = vpslld_avx2(auVar37,ZEXT416(uVar4));
    }
    iVar10 = -iVar10;
    auVar55._4_4_ = iVar10;
    auVar55._0_4_ = iVar10;
    auVar55._8_4_ = iVar10;
    auVar55._12_4_ = iVar10;
    auVar55._16_4_ = iVar10;
    auVar55._20_4_ = iVar10;
    auVar55._24_4_ = iVar10;
    auVar55._28_4_ = iVar10;
    auVar21 = vpmulld_avx2(auVar55,auVar51);
    local_428 = vpaddd_avx2(auVar22,auVar21);
    auVar21 = vpmulld_avx2(auVar55,auVar79);
    if (cos_bit == '\0') {
      local_288 = vpsubd_avx2(auVar66,auVar21);
    }
    else {
      local_428 = vpslld_avx2(local_428,ZEXT416(uVar4));
      auVar21 = vpsubd_avx2(auVar66,auVar21);
      local_288 = vpslld_avx2(auVar21,ZEXT416(uVar4));
    }
  }
  else {
    iVar6 = 1 << (cos_bit - 1U & 0x1f);
    auVar20._4_4_ = iVar6;
    auVar20._0_4_ = iVar6;
    auVar20._8_4_ = iVar6;
    auVar20._12_4_ = iVar6;
    auVar20._16_4_ = iVar6;
    auVar20._20_4_ = iVar6;
    auVar20._24_4_ = iVar6;
    auVar20._28_4_ = iVar6;
    auVar19 = vpaddd_avx2(local_5e8,auVar20);
    local_5e8 = vpsrad_avx2(auVar19,auVar12);
    auVar37 = vpsubd_avx2(auVar37,auVar21);
    auVar37 = vpaddd_avx2(auVar37,auVar20);
    local_3e8 = vpsrad_avx2(auVar37,auVar12);
    iVar9 = -iVar9;
    auVar47._4_4_ = iVar9;
    auVar47._0_4_ = iVar9;
    auVar47._8_4_ = iVar9;
    auVar47._12_4_ = iVar9;
    auVar47._16_4_ = iVar9;
    auVar47._20_4_ = iVar9;
    auVar47._24_4_ = iVar9;
    auVar47._28_4_ = iVar9;
    auVar37 = vpmulld_avx2(auVar47,auVar55);
    auVar37 = vpaddd_avx2(auVar14,auVar37);
    auVar37 = vpaddd_avx2(auVar37,auVar20);
    local_588 = vpsrad_avx2(auVar37,auVar12);
    auVar37 = vpmulld_avx2(auVar47,auVar15);
    auVar37 = vpsubd_avx2(auVar52,auVar37);
    auVar37 = vpaddd_avx2(auVar37,auVar20);
    auVar37 = vpsrad_avx2(auVar37,auVar12);
    iVar10 = -iVar10;
    auVar55._4_4_ = iVar10;
    auVar55._0_4_ = iVar10;
    auVar55._8_4_ = iVar10;
    auVar55._12_4_ = iVar10;
    auVar55._16_4_ = iVar10;
    auVar55._20_4_ = iVar10;
    auVar55._24_4_ = iVar10;
    auVar55._28_4_ = iVar10;
    auVar21 = vpmulld_avx2(auVar55,auVar51);
    auVar21 = vpaddd_avx2(auVar22,auVar21);
    auVar21 = vpaddd_avx2(auVar21,auVar20);
    local_428 = vpsrad_avx2(auVar21,auVar12);
    auVar21 = vpmulld_avx2(auVar55,auVar79);
    auVar21 = vpsubd_avx2(auVar66,auVar21);
    auVar21 = vpaddd_avx2(auVar21,auVar20);
    local_288 = vpsrad_avx2(auVar21,auVar12);
  }
  auVar21 = vpaddd_avx2(local_258,auVar17);
  auVar51 = vpaddd_avx2(local_4e8,auVar18);
  iVar7 = -iVar7;
  auVar22._4_4_ = iVar7;
  auVar22._0_4_ = iVar7;
  auVar22._8_4_ = iVar7;
  auVar22._12_4_ = iVar7;
  auVar22._16_4_ = iVar7;
  auVar22._20_4_ = iVar7;
  auVar22._24_4_ = iVar7;
  auVar22._28_4_ = iVar7;
  auVar79 = vpmulld_avx2(auVar22,auVar81);
  auVar15 = vpmulld_avx2(auVar55,auVar23);
  auVar79 = vpaddd_avx2(auVar79,auVar15);
  auVar81 = vpmulld_avx2(auVar55,auVar81);
  auVar55 = vpmulld_avx2(auVar22,auVar23);
  if (cos_bit < '\x01') {
    if (cos_bit == '\0') {
      local_5a8 = vpsubd_avx2(auVar81,auVar55);
    }
    else {
      auVar79 = vpslld_avx2(auVar79,ZEXT416(uVar4));
      auVar81 = vpsubd_avx2(auVar81,auVar55);
      local_5a8 = vpslld_avx2(auVar81,ZEXT416(uVar4));
    }
  }
  else {
    iVar6 = 1 << (cos_bit - 1U & 0x1f);
    auVar23._4_4_ = iVar6;
    auVar23._0_4_ = iVar6;
    auVar23._8_4_ = iVar6;
    auVar23._12_4_ = iVar6;
    auVar23._16_4_ = iVar6;
    auVar23._20_4_ = iVar6;
    auVar23._24_4_ = iVar6;
    auVar23._28_4_ = iVar6;
    auVar79 = vpaddd_avx2(auVar79,auVar23);
    auVar79 = vpsrad_avx2(auVar79,auVar12);
    auVar81 = vpsubd_avx2(auVar81,auVar55);
    auVar81 = vpaddd_avx2(auVar81,auVar23);
    local_5a8 = vpsrad_avx2(auVar81,auVar12);
  }
  auVar16 = vpsubd_avx2(auVar16,local_448);
  auVar81 = vpsubd_avx2(auVar25,auVar24);
  auVar55 = vpsubd_avx2(auVar17,local_258);
  auVar23 = vpsubd_avx2(auVar18,local_4e8);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x170);
  auVar24._4_4_ = uVar2;
  auVar24._0_4_ = uVar2;
  auVar24._8_4_ = uVar2;
  auVar24._12_4_ = uVar2;
  auVar24._16_4_ = uVar2;
  auVar24._20_4_ = uVar2;
  auVar24._24_4_ = uVar2;
  auVar24._28_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x250);
  auVar48._4_4_ = uVar2;
  auVar48._0_4_ = uVar2;
  auVar48._8_4_ = uVar2;
  auVar48._12_4_ = uVar2;
  auVar48._16_4_ = uVar2;
  auVar48._20_4_ = uVar2;
  auVar48._24_4_ = uVar2;
  auVar48._28_4_ = uVar2;
  auVar17 = vpmulld_avx2(auVar24,auVar51);
  auVar25 = vpmulld_avx2(auVar48,auVar21);
  local_528 = vpaddd_avx2(auVar25,auVar17);
  auVar17 = vpmulld_avx2(auVar48,auVar51);
  auVar21 = vpmulld_avx2(auVar24,auVar21);
  if (cos_bit < '\x01') {
    if (cos_bit == '\0') {
      auVar21 = vpsubd_avx2(auVar17,auVar21);
    }
    else {
      local_528 = vpslld_avx2(local_528,ZEXT416(uVar4));
      auVar21 = vpsubd_avx2(auVar17,auVar21);
      auVar21 = vpslld_avx2(auVar21,ZEXT416(uVar4));
    }
  }
  else {
    iVar6 = 1 << (cos_bit - 1U & 0x1f);
    auVar25._4_4_ = iVar6;
    auVar25._0_4_ = iVar6;
    auVar25._8_4_ = iVar6;
    auVar25._12_4_ = iVar6;
    auVar25._16_4_ = iVar6;
    auVar25._20_4_ = iVar6;
    auVar25._24_4_ = iVar6;
    auVar25._28_4_ = iVar6;
    auVar51 = vpaddd_avx2(local_528,auVar25);
    local_528 = vpsrad_avx2(auVar51,auVar12);
    auVar21 = vpsubd_avx2(auVar17,auVar21);
    auVar21 = vpaddd_avx2(auVar21,auVar25);
    auVar21 = vpsrad_avx2(auVar21,auVar12);
  }
  auVar25 = vpsubd_avx2((undefined1  [32])*input,(undefined1  [32])input[instride * 0x1f]);
  auVar18 = vpsubd_avx2((undefined1  [32])input[instride * 0xf],
                        (undefined1  [32])input[instride * 0x10]);
  auVar24 = vpsubd_avx2(auVar16,local_568);
  auVar15 = vpsubd_avx2(auVar81,auVar44);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x1f0);
  auVar26._4_4_ = uVar2;
  auVar26._0_4_ = uVar2;
  auVar26._8_4_ = uVar2;
  auVar26._12_4_ = uVar2;
  auVar26._16_4_ = uVar2;
  auVar26._20_4_ = uVar2;
  auVar26._24_4_ = uVar2;
  auVar26._28_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x1d0);
  auVar62._4_4_ = uVar2;
  auVar62._0_4_ = uVar2;
  auVar62._8_4_ = uVar2;
  auVar62._12_4_ = uVar2;
  auVar62._16_4_ = uVar2;
  auVar62._20_4_ = uVar2;
  auVar62._24_4_ = uVar2;
  auVar62._28_4_ = uVar2;
  auVar17 = vpmulld_avx2(auVar26,auVar23);
  auVar51 = vpmulld_avx2(auVar62,auVar55);
  local_448 = vpaddd_avx2(auVar51,auVar17);
  auVar17 = vpmulld_avx2(auVar62,auVar23);
  auVar51 = vpmulld_avx2(auVar26,auVar55);
  if (cos_bit < '\x01') {
    if (cos_bit == '\0') {
      auVar17 = vpsubd_avx2(auVar17,auVar51);
    }
    else {
      local_448 = vpslld_avx2(local_448,ZEXT416(uVar4));
      auVar17 = vpsubd_avx2(auVar17,auVar51);
      auVar17 = vpslld_avx2(auVar17,ZEXT416(uVar4));
    }
  }
  else {
    iVar6 = 1 << (cos_bit - 1U & 0x1f);
    auVar27._4_4_ = iVar6;
    auVar27._0_4_ = iVar6;
    auVar27._8_4_ = iVar6;
    auVar27._12_4_ = iVar6;
    auVar27._16_4_ = iVar6;
    auVar27._20_4_ = iVar6;
    auVar27._24_4_ = iVar6;
    auVar27._28_4_ = iVar6;
    auVar55 = vpaddd_avx2(local_448,auVar27);
    local_448 = vpsrad_avx2(auVar55,auVar12);
    auVar17 = vpsubd_avx2(auVar17,auVar51);
    auVar17 = vpaddd_avx2(auVar17,auVar27);
    auVar17 = vpsrad_avx2(auVar17,auVar12);
  }
  auVar51 = vpaddd_avx2(auVar18,local_3a8);
  auVar55 = vpaddd_avx2(auVar25,local_508);
  auVar16 = vpaddd_avx2(auVar16,local_568);
  auVar44 = vpaddd_avx2(auVar81,auVar44);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x1b0);
  auVar28._4_4_ = uVar2;
  auVar28._0_4_ = uVar2;
  auVar28._8_4_ = uVar2;
  auVar28._12_4_ = uVar2;
  auVar28._16_4_ = uVar2;
  auVar28._20_4_ = uVar2;
  auVar28._24_4_ = uVar2;
  auVar28._28_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x210);
  auVar82._4_4_ = uVar2;
  auVar82._0_4_ = uVar2;
  auVar82._8_4_ = uVar2;
  auVar82._12_4_ = uVar2;
  auVar82._16_4_ = uVar2;
  auVar82._20_4_ = uVar2;
  auVar82._24_4_ = uVar2;
  auVar82._28_4_ = uVar2;
  auVar81 = vpmulld_avx2(auVar28,auVar15);
  auVar23 = vpmulld_avx2(auVar82,auVar24);
  local_568 = vpaddd_avx2(auVar23,auVar81);
  auVar81 = vpmulld_avx2(auVar82,auVar15);
  auVar23 = vpmulld_avx2(auVar28,auVar24);
  if (cos_bit < '\x01') {
    if (cos_bit == '\0') {
      auVar81 = vpsubd_avx2(auVar81,auVar23);
    }
    else {
      local_568 = vpslld_avx2(local_568,ZEXT416(uVar4));
      auVar81 = vpsubd_avx2(auVar81,auVar23);
      auVar81 = vpslld_avx2(auVar81,ZEXT416(uVar4));
    }
  }
  else {
    iVar6 = 1 << (cos_bit - 1U & 0x1f);
    auVar29._4_4_ = iVar6;
    auVar29._0_4_ = iVar6;
    auVar29._8_4_ = iVar6;
    auVar29._12_4_ = iVar6;
    auVar29._16_4_ = iVar6;
    auVar29._20_4_ = iVar6;
    auVar29._24_4_ = iVar6;
    auVar29._28_4_ = iVar6;
    auVar24 = vpaddd_avx2(local_568,auVar29);
    local_568 = vpsrad_avx2(auVar24,auVar12);
    auVar81 = vpsubd_avx2(auVar81,auVar23);
    auVar81 = vpaddd_avx2(auVar81,auVar29);
    auVar81 = vpsrad_avx2(auVar81,auVar12);
  }
  auVar23 = vpaddd_avx2(auVar51,local_488);
  auVar24 = vpaddd_avx2(auVar55,local_4a8);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x230);
  auVar30._4_4_ = uVar2;
  auVar30._0_4_ = uVar2;
  auVar30._8_4_ = uVar2;
  auVar30._12_4_ = uVar2;
  auVar30._16_4_ = uVar2;
  auVar30._20_4_ = uVar2;
  auVar30._24_4_ = uVar2;
  auVar30._28_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 400);
  auVar83._4_4_ = uVar2;
  auVar83._0_4_ = uVar2;
  auVar83._8_4_ = uVar2;
  auVar83._12_4_ = uVar2;
  auVar83._16_4_ = uVar2;
  auVar83._20_4_ = uVar2;
  auVar83._24_4_ = uVar2;
  auVar83._28_4_ = uVar2;
  auVar15 = vpmulld_avx2(auVar30,auVar44);
  auVar14 = vpmulld_avx2(auVar83,auVar16);
  local_2c8 = vpaddd_avx2(auVar14,auVar15);
  auVar44 = vpmulld_avx2(auVar83,auVar44);
  auVar16 = vpmulld_avx2(auVar30,auVar16);
  if (cos_bit < '\x01') {
    if (cos_bit == '\0') {
      auVar44 = vpsubd_avx2(auVar44,auVar16);
    }
    else {
      local_2c8 = vpslld_avx2(local_2c8,ZEXT416(uVar4));
      auVar44 = vpsubd_avx2(auVar44,auVar16);
      auVar44 = vpslld_avx2(auVar44,ZEXT416(uVar4));
    }
  }
  else {
    iVar6 = 1 << (cos_bit - 1U & 0x1f);
    auVar31._4_4_ = iVar6;
    auVar31._0_4_ = iVar6;
    auVar31._8_4_ = iVar6;
    auVar31._12_4_ = iVar6;
    auVar31._16_4_ = iVar6;
    auVar31._20_4_ = iVar6;
    auVar31._24_4_ = iVar6;
    auVar31._28_4_ = iVar6;
    auVar15 = vpaddd_avx2(local_2c8,auVar31);
    local_2c8 = vpsrad_avx2(auVar15,auVar12);
    auVar44 = vpsubd_avx2(auVar44,auVar16);
    auVar44 = vpaddd_avx2(auVar44,auVar31);
    auVar44 = vpsrad_avx2(auVar44,auVar12);
  }
  auVar15 = vpsubd_avx2(auVar51,local_488);
  auVar14 = vpsubd_avx2(auVar55,local_4a8);
  auVar51 = vpaddd_avx2(auVar23,local_5e8);
  auVar52 = vpsubd_avx2(auVar23,local_5e8);
  auVar66 = vpsubd_avx2(auVar24,local_3e8);
  auVar16 = vpaddd_avx2(local_3e8,auVar24);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x168);
  auVar58._4_4_ = uVar2;
  auVar58._0_4_ = uVar2;
  auVar58._8_4_ = uVar2;
  auVar58._12_4_ = uVar2;
  auVar58._16_4_ = uVar2;
  auVar58._20_4_ = uVar2;
  auVar58._24_4_ = uVar2;
  auVar58._28_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 600);
  auVar71._4_4_ = uVar2;
  auVar71._0_4_ = uVar2;
  auVar71._8_4_ = uVar2;
  auVar71._12_4_ = uVar2;
  auVar71._16_4_ = uVar2;
  auVar71._20_4_ = uVar2;
  auVar71._24_4_ = uVar2;
  auVar71._28_4_ = uVar2;
  auVar55 = vpmulld_avx2(auVar58,auVar16);
  auVar23 = vpmulld_avx2(auVar71,auVar51);
  alVar86 = (__m256i)vpaddd_avx2(auVar23,auVar55);
  auVar16 = vpmulld_avx2(auVar71,auVar16);
  auVar51 = vpmulld_avx2(auVar58,auVar51);
  if (cos_bit < '\x01') {
    if (cos_bit == '\0') {
      auVar51 = vpsubd_avx2(auVar16,auVar51);
    }
    else {
      alVar86 = (__m256i)vpslld_avx2((undefined1  [32])alVar86,ZEXT416(uVar4));
      auVar51 = vpsubd_avx2(auVar16,auVar51);
      auVar51 = vpslld_avx2(auVar51,ZEXT416(uVar4));
    }
  }
  else {
    iVar6 = 1 << (cos_bit - 1U & 0x1f);
    auVar32._4_4_ = iVar6;
    auVar32._0_4_ = iVar6;
    auVar32._8_4_ = iVar6;
    auVar32._12_4_ = iVar6;
    auVar32._16_4_ = iVar6;
    auVar32._20_4_ = iVar6;
    auVar32._24_4_ = iVar6;
    auVar32._28_4_ = iVar6;
    auVar55 = vpaddd_avx2((undefined1  [32])alVar86,auVar32);
    alVar86 = (__m256i)vpsrad_avx2(auVar55,auVar12);
    auVar51 = vpsubd_avx2(auVar16,auVar51);
    auVar51 = vpaddd_avx2(auVar51,auVar32);
    auVar51 = vpsrad_avx2(auVar51,auVar12);
  }
  auVar23 = vpsubd_avx2(auVar18,local_3a8);
  auVar18 = vpsubd_avx2(auVar25,local_508);
  auVar24 = vpsubd_avx2(auVar15,local_588);
  auVar22 = vpsubd_avx2(auVar14,auVar37);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x1e8);
  auVar33._4_4_ = uVar2;
  auVar33._0_4_ = uVar2;
  auVar33._8_4_ = uVar2;
  auVar33._12_4_ = uVar2;
  auVar33._16_4_ = uVar2;
  auVar33._20_4_ = uVar2;
  auVar33._24_4_ = uVar2;
  auVar33._28_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x1d8);
  auVar72._4_4_ = uVar2;
  auVar72._0_4_ = uVar2;
  auVar72._8_4_ = uVar2;
  auVar72._12_4_ = uVar2;
  auVar72._16_4_ = uVar2;
  auVar72._20_4_ = uVar2;
  auVar72._24_4_ = uVar2;
  auVar72._28_4_ = uVar2;
  auVar25 = vpmulld_avx2(auVar33,auVar66);
  auVar16 = vpmulld_avx2(auVar72,auVar52);
  auVar25 = vpaddd_avx2(auVar16,auVar25);
  auVar16 = vpmulld_avx2(auVar72,auVar66);
  auVar55 = vpmulld_avx2(auVar33,auVar52);
  if (cos_bit < '\x01') {
    if (cos_bit == '\0') {
      auVar16 = vpsubd_avx2(auVar16,auVar55);
    }
    else {
      auVar25 = vpslld_avx2(auVar25,ZEXT416(uVar4));
      auVar16 = vpsubd_avx2(auVar16,auVar55);
      auVar16 = vpslld_avx2(auVar16,ZEXT416(uVar4));
    }
  }
  else {
    iVar6 = 1 << (cos_bit - 1U & 0x1f);
    auVar34._4_4_ = iVar6;
    auVar34._0_4_ = iVar6;
    auVar34._8_4_ = iVar6;
    auVar34._12_4_ = iVar6;
    auVar34._16_4_ = iVar6;
    auVar34._20_4_ = iVar6;
    auVar34._24_4_ = iVar6;
    auVar34._28_4_ = iVar6;
    auVar25 = vpaddd_avx2(auVar25,auVar34);
    auVar25 = vpsrad_avx2(auVar25,auVar12);
    auVar16 = vpsubd_avx2(auVar16,auVar55);
    auVar16 = vpaddd_avx2(auVar16,auVar34);
    auVar16 = vpsrad_avx2(auVar16,auVar12);
  }
  auVar52 = vpsubd_avx2(auVar23,local_548);
  auVar66 = vpsubd_avx2(auVar18,local_368);
  auVar55 = vpaddd_avx2(auVar15,local_588);
  auVar37 = vpaddd_avx2(auVar37,auVar14);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x1a8);
  auVar67._4_4_ = uVar2;
  auVar67._0_4_ = uVar2;
  auVar67._8_4_ = uVar2;
  auVar67._12_4_ = uVar2;
  auVar67._16_4_ = uVar2;
  auVar67._20_4_ = uVar2;
  auVar67._24_4_ = uVar2;
  auVar67._28_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x218);
  auVar73._4_4_ = uVar2;
  auVar73._0_4_ = uVar2;
  auVar73._8_4_ = uVar2;
  auVar73._12_4_ = uVar2;
  auVar73._16_4_ = uVar2;
  auVar73._20_4_ = uVar2;
  auVar73._24_4_ = uVar2;
  auVar73._28_4_ = uVar2;
  auVar15 = vpmulld_avx2(auVar67,auVar22);
  auVar14 = vpmulld_avx2(auVar73,auVar24);
  alVar63 = (__m256i)vpaddd_avx2(auVar14,auVar15);
  if (cos_bit < '\x01') {
    if (cos_bit == '\0') {
      auVar15 = vpmulld_avx2(auVar73,auVar22);
      auVar24 = vpmulld_avx2(auVar67,auVar24);
      auVar24 = vpsubd_avx2(auVar15,auVar24);
    }
    else {
      alVar63 = (__m256i)vpslld_avx2((undefined1  [32])alVar63,ZEXT416(uVar4));
      auVar15 = vpmulld_avx2(auVar73,auVar22);
      auVar24 = vpmulld_avx2(auVar67,auVar24);
      auVar24 = vpsubd_avx2(auVar15,auVar24);
      auVar24 = vpslld_avx2(auVar24,ZEXT416(uVar4));
    }
  }
  else {
    iVar6 = 1 << (cos_bit - 1U & 0x1f);
    auVar35._4_4_ = iVar6;
    auVar35._0_4_ = iVar6;
    auVar35._8_4_ = iVar6;
    auVar35._12_4_ = iVar6;
    auVar35._16_4_ = iVar6;
    auVar35._20_4_ = iVar6;
    auVar35._24_4_ = iVar6;
    auVar35._28_4_ = iVar6;
    auVar15 = vpaddd_avx2((undefined1  [32])alVar63,auVar35);
    alVar63 = (__m256i)vpsrad_avx2(auVar15,auVar12);
    auVar15 = vpmulld_avx2(auVar73,auVar22);
    auVar24 = vpmulld_avx2(auVar67,auVar24);
    auVar24 = vpsubd_avx2(auVar15,auVar24);
    auVar24 = vpaddd_avx2(auVar24,auVar35);
    auVar24 = vpsrad_avx2(auVar24,auVar12);
  }
  auVar15 = vpaddd_avx2(auVar52,local_428);
  auVar14 = vpaddd_avx2(auVar66,local_288);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x228);
  auVar57._4_4_ = uVar2;
  auVar57._0_4_ = uVar2;
  auVar57._8_4_ = uVar2;
  auVar57._12_4_ = uVar2;
  auVar57._16_4_ = uVar2;
  auVar57._20_4_ = uVar2;
  auVar57._24_4_ = uVar2;
  auVar57._28_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x198);
  auVar59._4_4_ = uVar2;
  auVar59._0_4_ = uVar2;
  auVar59._8_4_ = uVar2;
  auVar59._12_4_ = uVar2;
  auVar59._16_4_ = uVar2;
  auVar59._20_4_ = uVar2;
  auVar59._24_4_ = uVar2;
  auVar59._28_4_ = uVar2;
  auVar22 = vpmulld_avx2(auVar57,auVar37);
  auVar19 = vpmulld_avx2(auVar59,auVar55);
  alVar74 = (__m256i)vpaddd_avx2(auVar19,auVar22);
  if (cos_bit < '\x01') {
    if (cos_bit == '\0') {
      auVar37 = vpmulld_avx2(auVar59,auVar37);
      auVar55 = vpmulld_avx2(auVar57,auVar55);
      auVar37 = vpsubd_avx2(auVar37,auVar55);
    }
    else {
      alVar74 = (__m256i)vpslld_avx2((undefined1  [32])alVar74,ZEXT416(uVar4));
      auVar37 = vpmulld_avx2(auVar59,auVar37);
      auVar55 = vpmulld_avx2(auVar57,auVar55);
      auVar37 = vpsubd_avx2(auVar37,auVar55);
      auVar37 = vpslld_avx2(auVar37,ZEXT416(uVar4));
    }
  }
  else {
    iVar6 = 1 << (cos_bit - 1U & 0x1f);
    auVar36._4_4_ = iVar6;
    auVar36._0_4_ = iVar6;
    auVar36._8_4_ = iVar6;
    auVar36._12_4_ = iVar6;
    auVar36._16_4_ = iVar6;
    auVar36._20_4_ = iVar6;
    auVar36._24_4_ = iVar6;
    auVar36._28_4_ = iVar6;
    auVar22 = vpaddd_avx2((undefined1  [32])alVar74,auVar36);
    alVar74 = (__m256i)vpsrad_avx2(auVar22,auVar12);
    auVar37 = vpmulld_avx2(auVar59,auVar37);
    auVar55 = vpmulld_avx2(auVar57,auVar55);
    auVar37 = vpsubd_avx2(auVar37,auVar55);
    auVar37 = vpaddd_avx2(auVar37,auVar36);
    auVar37 = vpsrad_avx2(auVar37,auVar12);
  }
  auVar55 = vpaddd_avx2(auVar23,local_548);
  auVar23 = vpaddd_avx2(auVar18,local_368);
  auVar22 = vpsubd_avx2(auVar52,local_428);
  auVar66 = vpsubd_avx2(auVar66,local_288);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x188);
  auVar45._4_4_ = uVar2;
  auVar45._0_4_ = uVar2;
  auVar45._8_4_ = uVar2;
  auVar45._12_4_ = uVar2;
  auVar45._16_4_ = uVar2;
  auVar45._20_4_ = uVar2;
  auVar45._24_4_ = uVar2;
  auVar45._28_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x238);
  auVar49._4_4_ = uVar2;
  auVar49._0_4_ = uVar2;
  auVar49._8_4_ = uVar2;
  auVar49._12_4_ = uVar2;
  auVar49._16_4_ = uVar2;
  auVar49._20_4_ = uVar2;
  auVar49._24_4_ = uVar2;
  auVar49._28_4_ = uVar2;
  auVar18 = vpmulld_avx2(auVar45,auVar14);
  auVar52 = vpmulld_avx2(auVar49,auVar15);
  alVar60 = (__m256i)vpaddd_avx2(auVar52,auVar18);
  if (cos_bit < '\x01') {
    if (cos_bit == '\0') {
      auVar18 = vpmulld_avx2(auVar49,auVar14);
      auVar15 = vpmulld_avx2(auVar45,auVar15);
      auVar18 = vpsubd_avx2(auVar18,auVar15);
    }
    else {
      alVar60 = (__m256i)vpslld_avx2((undefined1  [32])alVar60,ZEXT416(uVar4));
      auVar18 = vpmulld_avx2(auVar49,auVar14);
      auVar15 = vpmulld_avx2(auVar45,auVar15);
      auVar18 = vpsubd_avx2(auVar18,auVar15);
      auVar18 = vpslld_avx2(auVar18,ZEXT416(uVar4));
    }
  }
  else {
    iVar6 = 1 << (cos_bit - 1U & 0x1f);
    auVar38._4_4_ = iVar6;
    auVar38._0_4_ = iVar6;
    auVar38._8_4_ = iVar6;
    auVar38._12_4_ = iVar6;
    auVar38._16_4_ = iVar6;
    auVar38._20_4_ = iVar6;
    auVar38._24_4_ = iVar6;
    auVar38._28_4_ = iVar6;
    auVar18 = vpaddd_avx2((undefined1  [32])alVar60,auVar38);
    alVar60 = (__m256i)vpsrad_avx2(auVar18,auVar12);
    auVar18 = vpmulld_avx2(auVar49,auVar14);
    auVar15 = vpmulld_avx2(auVar45,auVar15);
    auVar18 = vpsubd_avx2(auVar18,auVar15);
    auVar18 = vpaddd_avx2(auVar18,auVar38);
    auVar18 = vpsrad_avx2(auVar18,auVar12);
  }
  auVar52 = vpsubd_avx2(auVar55,auVar79);
  auVar19 = vpsubd_avx2(auVar23,local_5a8);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x208);
  auVar68._4_4_ = uVar2;
  auVar68._0_4_ = uVar2;
  auVar68._8_4_ = uVar2;
  auVar68._12_4_ = uVar2;
  auVar68._16_4_ = uVar2;
  auVar68._20_4_ = uVar2;
  auVar68._24_4_ = uVar2;
  auVar68._28_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x1b8);
  auVar84._4_4_ = uVar2;
  auVar84._0_4_ = uVar2;
  auVar84._8_4_ = uVar2;
  auVar84._12_4_ = uVar2;
  auVar84._16_4_ = uVar2;
  auVar84._20_4_ = uVar2;
  auVar84._24_4_ = uVar2;
  auVar84._28_4_ = uVar2;
  auVar15 = vpmulld_avx2(auVar68,auVar66);
  auVar14 = vpmulld_avx2(auVar84,auVar22);
  alVar46 = (__m256i)vpaddd_avx2(auVar14,auVar15);
  if (cos_bit < '\x01') {
    if (cos_bit == '\0') {
      auVar15 = vpmulld_avx2(auVar84,auVar66);
      auVar14 = vpmulld_avx2(auVar68,auVar22);
      alVar69 = (__m256i)vpsubd_avx2(auVar15,auVar14);
    }
    else {
      alVar46 = (__m256i)vpslld_avx2((undefined1  [32])alVar46,ZEXT416(uVar4));
      auVar15 = vpmulld_avx2(auVar84,auVar66);
      auVar14 = vpmulld_avx2(auVar68,auVar22);
      auVar15 = vpsubd_avx2(auVar15,auVar14);
      alVar69 = (__m256i)vpslld_avx2(auVar15,ZEXT416(uVar4));
    }
  }
  else {
    iVar6 = 1 << (cos_bit - 1U & 0x1f);
    auVar39._4_4_ = iVar6;
    auVar39._0_4_ = iVar6;
    auVar39._8_4_ = iVar6;
    auVar39._12_4_ = iVar6;
    auVar39._16_4_ = iVar6;
    auVar39._20_4_ = iVar6;
    auVar39._24_4_ = iVar6;
    auVar39._28_4_ = iVar6;
    auVar15 = vpaddd_avx2((undefined1  [32])alVar46,auVar39);
    alVar46 = (__m256i)vpsrad_avx2(auVar15,auVar12);
    auVar15 = vpmulld_avx2(auVar84,auVar66);
    auVar14 = vpmulld_avx2(auVar68,auVar22);
    auVar15 = vpsubd_avx2(auVar15,auVar14);
    auVar15 = vpaddd_avx2(auVar15,auVar39);
    alVar69 = (__m256i)vpsrad_avx2(auVar15,auVar12);
  }
  auVar79 = vpaddd_avx2(auVar79,auVar55);
  auVar55 = vpaddd_avx2(auVar23,local_5a8);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x1c8);
  auVar53._4_4_ = uVar2;
  auVar53._0_4_ = uVar2;
  auVar53._8_4_ = uVar2;
  auVar53._12_4_ = uVar2;
  auVar53._16_4_ = uVar2;
  auVar53._20_4_ = uVar2;
  auVar53._24_4_ = uVar2;
  auVar53._28_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x1f8);
  auVar76._4_4_ = uVar2;
  auVar76._0_4_ = uVar2;
  auVar76._8_4_ = uVar2;
  auVar76._12_4_ = uVar2;
  auVar76._16_4_ = uVar2;
  auVar76._20_4_ = uVar2;
  auVar76._24_4_ = uVar2;
  auVar76._28_4_ = uVar2;
  auVar23 = vpmulld_avx2(auVar53,auVar19);
  auVar15 = vpmulld_avx2(auVar76,auVar52);
  alVar80 = (__m256i)vpaddd_avx2(auVar15,auVar23);
  if (cos_bit < '\x01') {
    if (cos_bit == '\0') {
      auVar23 = vpmulld_avx2(auVar76,auVar19);
      auVar15 = vpmulld_avx2(auVar53,auVar52);
      alVar3 = (__m256i)vpsubd_avx2(auVar23,auVar15);
    }
    else {
      alVar80 = (__m256i)vpslld_avx2((undefined1  [32])alVar80,ZEXT416(uVar4));
      auVar23 = vpmulld_avx2(auVar76,auVar19);
      auVar15 = vpmulld_avx2(auVar53,auVar52);
      auVar23 = vpsubd_avx2(auVar23,auVar15);
      alVar3 = (__m256i)vpslld_avx2(auVar23,ZEXT416(uVar4));
    }
  }
  else {
    iVar6 = 1 << (cos_bit - 1U & 0x1f);
    auVar40._4_4_ = iVar6;
    auVar40._0_4_ = iVar6;
    auVar40._8_4_ = iVar6;
    auVar40._12_4_ = iVar6;
    auVar40._16_4_ = iVar6;
    auVar40._20_4_ = iVar6;
    auVar40._24_4_ = iVar6;
    auVar40._28_4_ = iVar6;
    auVar23 = vpaddd_avx2((undefined1  [32])alVar80,auVar40);
    alVar80 = (__m256i)vpsrad_avx2(auVar23,auVar12);
    auVar23 = vpmulld_avx2(auVar76,auVar19);
    auVar15 = vpmulld_avx2(auVar53,auVar52);
    auVar23 = vpsubd_avx2(auVar23,auVar15);
    auVar23 = vpaddd_avx2(auVar23,auVar40);
    alVar3 = (__m256i)vpsrad_avx2(auVar23,auVar12);
  }
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x248);
  auVar77._4_4_ = uVar2;
  auVar77._0_4_ = uVar2;
  auVar77._8_4_ = uVar2;
  auVar77._12_4_ = uVar2;
  auVar77._16_4_ = uVar2;
  auVar77._20_4_ = uVar2;
  auVar77._24_4_ = uVar2;
  auVar77._28_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x178);
  auVar85._4_4_ = uVar2;
  auVar85._0_4_ = uVar2;
  auVar85._8_4_ = uVar2;
  auVar85._12_4_ = uVar2;
  auVar85._16_4_ = uVar2;
  auVar85._20_4_ = uVar2;
  auVar85._24_4_ = uVar2;
  auVar85._28_4_ = uVar2;
  auVar23 = vpmulld_avx2(auVar77,auVar55);
  auVar15 = vpmulld_avx2(auVar85,auVar79);
  alVar54 = (__m256i)vpaddd_avx2(auVar15,auVar23);
  if (cos_bit < '\x01') {
    if (cos_bit == '\0') {
      auVar55 = vpmulld_avx2(auVar85,auVar55);
      auVar79 = vpmulld_avx2(auVar77,auVar79);
      alVar42 = (__m256i)vpsubd_avx2(auVar55,auVar79);
    }
    else {
      alVar54 = (__m256i)vpslld_avx2((undefined1  [32])alVar54,ZEXT416(uVar4));
      auVar55 = vpmulld_avx2(auVar85,auVar55);
      auVar79 = vpmulld_avx2(auVar77,auVar79);
      auVar79 = vpsubd_avx2(auVar55,auVar79);
      alVar42 = (__m256i)vpslld_avx2(auVar79,ZEXT416(uVar4));
    }
  }
  else {
    iVar6 = 1 << (cos_bit - 1U & 0x1f);
    auVar41._4_4_ = iVar6;
    auVar41._0_4_ = iVar6;
    auVar41._8_4_ = iVar6;
    auVar41._12_4_ = iVar6;
    auVar41._16_4_ = iVar6;
    auVar41._20_4_ = iVar6;
    auVar41._24_4_ = iVar6;
    auVar41._28_4_ = iVar6;
    auVar23 = vpaddd_avx2((undefined1  [32])alVar54,auVar41);
    alVar54 = (__m256i)vpsrad_avx2(auVar23,auVar12);
    auVar55 = vpmulld_avx2(auVar85,auVar55);
    auVar79 = vpmulld_avx2(auVar77,auVar79);
    auVar79 = vpsubd_avx2(auVar55,auVar79);
    auVar79 = vpaddd_avx2(auVar79,auVar41);
    alVar42 = (__m256i)vpsrad_avx2(auVar79,auVar12);
  }
  local_138 = auVar88._0_8_;
  lStack_130 = auVar88._8_8_;
  lStack_128 = auVar88._16_8_;
  lStack_120 = auVar88._24_8_;
  (*output)[0] = local_328._0_8_;
  (*output)[1] = local_328._8_8_;
  (*output)[2] = local_328._16_8_;
  (*output)[3] = local_328._24_8_;
  local_4a8._0_8_ = auVar51._0_8_;
  local_4a8._8_8_ = auVar51._8_8_;
  local_4a8._16_8_ = auVar51._16_8_;
  local_4a8._24_8_ = auVar51._24_8_;
  palVar1 = output + outstride * 0x1f;
  (*palVar1)[0] = local_4a8._0_8_;
  (*palVar1)[1] = local_4a8._8_8_;
  (*palVar1)[2] = local_4a8._16_8_;
  (*palVar1)[3] = local_4a8._24_8_;
  output[outstride] = alVar86;
  local_468 = auVar21._0_8_;
  lStack_460 = auVar21._8_8_;
  lStack_458 = auVar21._16_8_;
  lStack_450 = auVar21._24_8_;
  palVar1 = output + outstride * 0x1e;
  (*palVar1)[0] = local_468;
  (*palVar1)[1] = lStack_460;
  (*palVar1)[2] = lStack_458;
  (*palVar1)[3] = lStack_450;
  palVar1 = output + outstride * 2;
  (*palVar1)[0] = local_528._0_8_;
  (*palVar1)[1] = local_528._8_8_;
  (*palVar1)[2] = local_528._16_8_;
  (*palVar1)[3] = local_528._24_8_;
  output[outstride * 0x1d] = alVar54;
  output[outstride * 3] = alVar42;
  local_1b8 = auVar87._0_8_;
  lStack_1b0 = auVar87._8_8_;
  lStack_1a8 = auVar87._16_8_;
  lStack_1a0 = auVar87._24_8_;
  palVar1 = output + outstride * 0x1c;
  (*palVar1)[0] = local_1b8;
  (*palVar1)[1] = lStack_1b0;
  (*palVar1)[2] = lStack_1a8;
  (*palVar1)[3] = lStack_1a0;
  palVar1 = output + outstride * 4;
  (*palVar1)[0] = local_178._0_8_;
  (*palVar1)[1] = local_178._8_8_;
  (*palVar1)[2] = local_178._16_8_;
  (*palVar1)[3] = local_178._24_8_;
  local_548._0_8_ = auVar18._0_8_;
  local_548._8_8_ = auVar18._8_8_;
  local_548._16_8_ = auVar18._16_8_;
  local_548._24_8_ = auVar18._24_8_;
  palVar1 = output + outstride * 0x1b;
  (*palVar1)[0] = local_548._0_8_;
  (*palVar1)[1] = local_548._8_8_;
  (*palVar1)[2] = local_548._16_8_;
  (*palVar1)[3] = local_548._24_8_;
  output[outstride * 5] = alVar60;
  palVar1 = output + outstride * 0x1a;
  (*palVar1)[0] = local_2c8._0_8_;
  (*palVar1)[1] = local_2c8._8_8_;
  (*palVar1)[2] = local_2c8._16_8_;
  (*palVar1)[3] = local_2c8._24_8_;
  local_198 = auVar44._0_8_;
  lStack_190 = auVar44._8_8_;
  lStack_188 = auVar44._16_8_;
  lStack_180 = auVar44._24_8_;
  palVar1 = output + outstride * 6;
  (*palVar1)[0] = local_198;
  (*palVar1)[1] = lStack_190;
  (*palVar1)[2] = lStack_188;
  (*palVar1)[3] = lStack_180;
  output[outstride * 0x19] = alVar74;
  local_588._0_8_ = auVar37._0_8_;
  local_588._8_8_ = auVar37._8_8_;
  local_588._16_8_ = auVar37._16_8_;
  local_588._24_8_ = auVar37._24_8_;
  palVar1 = output + outstride * 7;
  (*palVar1)[0] = local_588._0_8_;
  (*palVar1)[1] = local_588._8_8_;
  (*palVar1)[2] = local_588._16_8_;
  (*palVar1)[3] = local_588._24_8_;
  palVar1 = output + outstride * 0x18;
  (*palVar1)[0] = local_308._0_8_;
  (*palVar1)[1] = local_308._8_8_;
  (*palVar1)[2] = local_308._16_8_;
  (*palVar1)[3] = local_308._24_8_;
  palVar1 = output + outstride * 8;
  (*palVar1)[0] = local_3c8._0_8_;
  (*palVar1)[1] = local_3c8._8_8_;
  (*palVar1)[2] = local_3c8._16_8_;
  (*palVar1)[3] = local_3c8._24_8_;
  local_488._0_8_ = auVar24._0_8_;
  local_488._8_8_ = auVar24._8_8_;
  local_488._16_8_ = auVar24._16_8_;
  local_488._24_8_ = auVar24._24_8_;
  palVar1 = output + outstride * 0x17;
  (*palVar1)[0] = local_488._0_8_;
  (*palVar1)[1] = local_488._8_8_;
  (*palVar1)[2] = local_488._16_8_;
  (*palVar1)[3] = local_488._24_8_;
  output[outstride * 9] = alVar63;
  local_5c8 = auVar81._0_8_;
  lStack_5c0 = auVar81._8_8_;
  lStack_5b8 = auVar81._16_8_;
  lStack_5b0 = auVar81._24_8_;
  palVar1 = output + outstride * 0x16;
  (*palVar1)[0] = local_5c8;
  (*palVar1)[1] = lStack_5c0;
  (*palVar1)[2] = lStack_5b8;
  (*palVar1)[3] = lStack_5b0;
  palVar1 = output + outstride * 10;
  (*palVar1)[0] = local_568._0_8_;
  (*palVar1)[1] = local_568._8_8_;
  (*palVar1)[2] = local_568._16_8_;
  (*palVar1)[3] = local_568._24_8_;
  output[outstride * 0x15] = alVar46;
  output[outstride * 0xb] = alVar69;
  palVar1 = output + outstride * 0x14;
  (*palVar1)[0] = local_138;
  (*palVar1)[1] = lStack_130;
  (*palVar1)[2] = lStack_128;
  (*palVar1)[3] = lStack_120;
  local_158 = auVar43._0_8_;
  lStack_150 = auVar43._8_8_;
  lStack_148 = auVar43._16_8_;
  lStack_140 = auVar43._24_8_;
  palVar1 = output + outstride * 0xc;
  (*palVar1)[0] = local_158;
  (*palVar1)[1] = lStack_150;
  (*palVar1)[2] = lStack_148;
  (*palVar1)[3] = lStack_140;
  output[outstride * 0x13] = alVar3;
  output[outstride * 0xd] = alVar80;
  palVar1 = output + outstride * 0x12;
  (*palVar1)[0] = local_448._0_8_;
  (*palVar1)[1] = local_448._8_8_;
  (*palVar1)[2] = local_448._16_8_;
  (*palVar1)[3] = local_448._24_8_;
  local_388 = auVar17._0_8_;
  lStack_380 = auVar17._8_8_;
  lStack_378 = auVar17._16_8_;
  lStack_370 = auVar17._24_8_;
  palVar1 = output + outstride * 0xe;
  (*palVar1)[0] = local_388;
  (*palVar1)[1] = lStack_380;
  (*palVar1)[2] = lStack_378;
  (*palVar1)[3] = lStack_370;
  local_3a8._0_8_ = auVar25._0_8_;
  local_3a8._8_8_ = auVar25._8_8_;
  local_3a8._16_8_ = auVar25._16_8_;
  local_3a8._24_8_ = auVar25._24_8_;
  palVar1 = output + outstride * 0x11;
  (*palVar1)[0] = local_3a8._0_8_;
  (*palVar1)[1] = local_3a8._8_8_;
  (*palVar1)[2] = local_3a8._16_8_;
  (*palVar1)[3] = local_3a8._24_8_;
  local_508._0_8_ = auVar16._0_8_;
  local_508._8_8_ = auVar16._8_8_;
  local_508._16_8_ = auVar16._16_8_;
  local_508._24_8_ = auVar16._24_8_;
  palVar1 = output + outstride * 0xf;
  (*palVar1)[0] = local_508._0_8_;
  (*palVar1)[1] = local_508._8_8_;
  (*palVar1)[2] = local_508._16_8_;
  (*palVar1)[3] = local_508._24_8_;
  palVar1 = output + outstride * 0x10;
  (*palVar1)[0] = local_4c8._0_8_;
  (*palVar1)[1] = local_4c8._8_8_;
  (*palVar1)[2] = local_4c8._16_8_;
  (*palVar1)[3] = local_4c8._24_8_;
  return;
}

Assistant:

static inline void fdct32_avx2(const __m256i *input, __m256i *output,
                               int8_t cos_bit) {
  __m256i x1[32];
  const int32_t *cospi = cospi_arr(cos_bit);
  const __m256i _r = _mm256_set1_epi32(1 << (cos_bit - 1));
  // stage 0
  // stage 1
  btf_32_add_sub_out_avx2(&x1[0], &x1[31], input[0], input[31]);
  btf_32_add_sub_out_avx2(&x1[1], &x1[30], input[1], input[30]);
  btf_32_add_sub_out_avx2(&x1[2], &x1[29], input[2], input[29]);
  btf_32_add_sub_out_avx2(&x1[3], &x1[28], input[3], input[28]);
  btf_32_add_sub_out_avx2(&x1[4], &x1[27], input[4], input[27]);
  btf_32_add_sub_out_avx2(&x1[5], &x1[26], input[5], input[26]);
  btf_32_add_sub_out_avx2(&x1[6], &x1[25], input[6], input[25]);
  btf_32_add_sub_out_avx2(&x1[7], &x1[24], input[7], input[24]);
  btf_32_add_sub_out_avx2(&x1[8], &x1[23], input[8], input[23]);
  btf_32_add_sub_out_avx2(&x1[9], &x1[22], input[9], input[22]);
  btf_32_add_sub_out_avx2(&x1[10], &x1[21], input[10], input[21]);
  btf_32_add_sub_out_avx2(&x1[11], &x1[20], input[11], input[20]);
  btf_32_add_sub_out_avx2(&x1[12], &x1[19], input[12], input[19]);
  btf_32_add_sub_out_avx2(&x1[13], &x1[18], input[13], input[18]);
  btf_32_add_sub_out_avx2(&x1[14], &x1[17], input[14], input[17]);
  btf_32_add_sub_out_avx2(&x1[15], &x1[16], input[15], input[16]);

  // stage 2
  btf_32_add_sub_avx2(&x1[0], &x1[15]);
  btf_32_add_sub_avx2(&x1[1], &x1[14]);
  btf_32_add_sub_avx2(&x1[2], &x1[13]);
  btf_32_add_sub_avx2(&x1[3], &x1[12]);
  btf_32_add_sub_avx2(&x1[4], &x1[11]);
  btf_32_add_sub_avx2(&x1[5], &x1[10]);
  btf_32_add_sub_avx2(&x1[6], &x1[9]);
  btf_32_add_sub_avx2(&x1[7], &x1[8]);
  btf_32_avx2_type0(-cospi[32], cospi[32], &x1[20], &x1[27], _r, cos_bit);
  btf_32_avx2_type0(-cospi[32], cospi[32], &x1[21], &x1[26], _r, cos_bit);
  btf_32_avx2_type0(-cospi[32], cospi[32], &x1[22], &x1[25], _r, cos_bit);
  btf_32_avx2_type0(-cospi[32], cospi[32], &x1[23], &x1[24], _r, cos_bit);

  // stage 3
  btf_32_add_sub_avx2(&x1[0], &x1[7]);
  btf_32_add_sub_avx2(&x1[1], &x1[6]);
  btf_32_add_sub_avx2(&x1[2], &x1[5]);
  btf_32_add_sub_avx2(&x1[3], &x1[4]);
  btf_32_avx2_type0(-cospi[32], cospi[32], &x1[10], &x1[13], _r, cos_bit);
  btf_32_avx2_type0(-cospi[32], cospi[32], &x1[11], &x1[12], _r, cos_bit);
  btf_32_add_sub_avx2(&x1[16], &x1[23]);
  btf_32_add_sub_avx2(&x1[17], &x1[22]);
  btf_32_add_sub_avx2(&x1[18], &x1[21]);
  btf_32_add_sub_avx2(&x1[19], &x1[20]);
  btf_32_add_sub_avx2(&x1[31], &x1[24]);
  btf_32_add_sub_avx2(&x1[30], &x1[25]);
  btf_32_add_sub_avx2(&x1[29], &x1[26]);
  btf_32_add_sub_avx2(&x1[28], &x1[27]);

  // stage 4
  btf_32_add_sub_avx2(&x1[0], &x1[3]);
  btf_32_add_sub_avx2(&x1[1], &x1[2]);
  btf_32_avx2_type0(-cospi[32], cospi[32], &x1[5], &x1[6], _r, cos_bit);
  btf_32_add_sub_avx2(&x1[8], &x1[11]);
  btf_32_add_sub_avx2(&x1[9], &x1[10]);
  btf_32_add_sub_avx2(&x1[15], &x1[12]);
  btf_32_add_sub_avx2(&x1[14], &x1[13]);
  btf_32_avx2_type0(-cospi[16], cospi[48], &x1[18], &x1[29], _r, cos_bit);
  btf_32_avx2_type0(-cospi[16], cospi[48], &x1[19], &x1[28], _r, cos_bit);
  btf_32_avx2_type0(-cospi[48], -cospi[16], &x1[20], &x1[27], _r, cos_bit);
  btf_32_avx2_type0(-cospi[48], -cospi[16], &x1[21], &x1[26], _r, cos_bit);

  // stage 5
  btf_32_avx2_type0(cospi[32], cospi[32], &x1[0], &x1[1], _r, cos_bit);
  btf_32_avx2_type1(cospi[48], cospi[16], &x1[2], &x1[3], _r, cos_bit);
  btf_32_add_sub_avx2(&x1[4], &x1[5]);
  btf_32_add_sub_avx2(&x1[7], &x1[6]);
  btf_32_avx2_type0(-cospi[16], cospi[48], &x1[9], &x1[14], _r, cos_bit);
  btf_32_avx2_type0(-cospi[48], -cospi[16], &x1[10], &x1[13], _r, cos_bit);
  btf_32_add_sub_avx2(&x1[16], &x1[19]);
  btf_32_add_sub_avx2(&x1[17], &x1[18]);
  btf_32_add_sub_avx2(&x1[23], &x1[20]);
  btf_32_add_sub_avx2(&x1[22], &x1[21]);
  btf_32_add_sub_avx2(&x1[24], &x1[27]);
  btf_32_add_sub_avx2(&x1[25], &x1[26]);
  btf_32_add_sub_avx2(&x1[31], &x1[28]);
  btf_32_add_sub_avx2(&x1[30], &x1[29]);

  // stage 6
  btf_32_avx2_type1(cospi[56], cospi[8], &x1[4], &x1[7], _r, cos_bit);
  btf_32_avx2_type1(cospi[24], cospi[40], &x1[5], &x1[6], _r, cos_bit);
  btf_32_add_sub_avx2(&x1[8], &x1[9]);
  btf_32_add_sub_avx2(&x1[11], &x1[10]);
  btf_32_add_sub_avx2(&x1[12], &x1[13]);
  btf_32_add_sub_avx2(&x1[15], &x1[14]);
  btf_32_avx2_type0(-cospi[8], cospi[56], &x1[17], &x1[30], _r, cos_bit);
  btf_32_avx2_type0(-cospi[56], -cospi[8], &x1[18], &x1[29], _r, cos_bit);
  btf_32_avx2_type0(-cospi[40], cospi[24], &x1[21], &x1[26], _r, cos_bit);
  btf_32_avx2_type0(-cospi[24], -cospi[40], &x1[22], &x1[25], _r, cos_bit);

  // stage 7
  btf_32_avx2_type1(cospi[60], cospi[4], &x1[8], &x1[15], _r, cos_bit);
  btf_32_avx2_type1(cospi[28], cospi[36], &x1[9], &x1[14], _r, cos_bit);
  btf_32_avx2_type1(cospi[44], cospi[20], &x1[10], &x1[13], _r, cos_bit);
  btf_32_avx2_type1(cospi[12], cospi[52], &x1[11], &x1[12], _r, cos_bit);
  btf_32_add_sub_avx2(&x1[16], &x1[17]);
  btf_32_add_sub_avx2(&x1[19], &x1[18]);
  btf_32_add_sub_avx2(&x1[20], &x1[21]);
  btf_32_add_sub_avx2(&x1[23], &x1[22]);
  btf_32_add_sub_avx2(&x1[24], &x1[25]);
  btf_32_add_sub_avx2(&x1[27], &x1[26]);
  btf_32_add_sub_avx2(&x1[28], &x1[29]);
  btf_32_add_sub_avx2(&x1[31], &x1[30]);

  // stage 8
  btf_32_avx2_type1(cospi[62], cospi[2], &x1[16], &x1[31], _r, cos_bit);
  btf_32_avx2_type1(cospi[30], cospi[34], &x1[17], &x1[30], _r, cos_bit);
  btf_32_avx2_type1(cospi[46], cospi[18], &x1[18], &x1[29], _r, cos_bit);
  btf_32_avx2_type1(cospi[14], cospi[50], &x1[19], &x1[28], _r, cos_bit);
  btf_32_avx2_type1(cospi[54], cospi[10], &x1[20], &x1[27], _r, cos_bit);
  btf_32_avx2_type1(cospi[22], cospi[42], &x1[21], &x1[26], _r, cos_bit);
  btf_32_avx2_type1(cospi[38], cospi[26], &x1[22], &x1[25], _r, cos_bit);
  btf_32_avx2_type1(cospi[6], cospi[58], &x1[23], &x1[24], _r, cos_bit);

  // stage 9
  output[0] = x1[0];
  output[1] = x1[16];
  output[2] = x1[8];
  output[3] = x1[24];
  output[4] = x1[4];
  output[5] = x1[20];
  output[6] = x1[12];
  output[7] = x1[28];
  output[8] = x1[2];
  output[9] = x1[18];
  output[10] = x1[10];
  output[11] = x1[26];
  output[12] = x1[6];
  output[13] = x1[22];
  output[14] = x1[14];
  output[15] = x1[30];
  output[16] = x1[1];
  output[17] = x1[17];
  output[18] = x1[9];
  output[19] = x1[25];
  output[20] = x1[5];
  output[21] = x1[21];
  output[22] = x1[13];
  output[23] = x1[29];
  output[24] = x1[3];
  output[25] = x1[19];
  output[26] = x1[11];
  output[27] = x1[27];
  output[28] = x1[7];
  output[29] = x1[23];
  output[30] = x1[15];
  output[31] = x1[31];
}